

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconinter.c
# Opt level: O0

void diffwtd_mask_d16(uint8_t *mask,int which_inverse,int mask_base,CONV_BUF_TYPE *src0,
                     int src0_stride,CONV_BUF_TYPE *src1,int src1_stride,int h,int w,
                     ConvolveParams *conv_params,int bd)

{
  int iVar1;
  byte bVar2;
  long in_RCX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  int in_R8D;
  long in_R9;
  int in_stack_00000008;
  int diff;
  int m;
  int j;
  int i;
  int round;
  char in_stack_00000028;
  char local_40;
  int local_34;
  int local_30;
  
  bVar2 = (-(char)*(undefined4 *)(src1 + 0xc) - (char)*(undefined4 *)(src1 + 10)) +
          in_stack_00000028 + '\x06';
  for (local_30 = 0; local_30 < m; local_30 = local_30 + 1) {
    for (local_34 = 0; local_34 < i; local_34 = local_34 + 1) {
      iVar1 = (uint)*(ushort *)(in_RCX + (long)(local_30 * in_R8D + local_34) * 2) -
              (uint)*(ushort *)(in_R9 + (long)(local_30 * in_stack_00000008 + local_34) * 2);
      if (iVar1 < 1) {
        iVar1 = -iVar1;
      }
      iVar1 = clamp(in_EDX + (iVar1 + ((1 << (bVar2 & 0x1f)) >> 1) >> (bVar2 & 0x1f)) / 0x10,0,0x40)
      ;
      local_40 = (char)iVar1;
      if (in_ESI != 0) {
        local_40 = '@' - local_40;
      }
      *(char *)(in_RDI + (local_30 * i + local_34)) = local_40;
    }
  }
  return;
}

Assistant:

static inline void diffwtd_mask_d16(uint8_t *mask, int which_inverse,
                                    int mask_base, const CONV_BUF_TYPE *src0,
                                    int src0_stride, const CONV_BUF_TYPE *src1,
                                    int src1_stride, int h, int w,
                                    ConvolveParams *conv_params, int bd) {
  int round =
      2 * FILTER_BITS - conv_params->round_0 - conv_params->round_1 + (bd - 8);
  int i, j, m, diff;
  for (i = 0; i < h; ++i) {
    for (j = 0; j < w; ++j) {
      diff = abs(src0[i * src0_stride + j] - src1[i * src1_stride + j]);
      diff = ROUND_POWER_OF_TWO(diff, round);
      m = clamp(mask_base + (diff / DIFF_FACTOR), 0, AOM_BLEND_A64_MAX_ALPHA);
      mask[i * w + j] = which_inverse ? AOM_BLEND_A64_MAX_ALPHA - m : m;
    }
  }
}